

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5TokenizerModule * fts5LocateTokenizer(Fts5Global *pGlobal,char *zName)

{
  int iVar1;
  Fts5TokenizerModule **ppFVar2;
  Fts5TokenizerModule *pFVar3;
  
  if (zName == (char *)0x0) {
    pFVar3 = pGlobal->pDfltTok;
  }
  else {
    ppFVar2 = &pGlobal->pTok;
    while (pFVar3 = *ppFVar2, pFVar3 != (Fts5TokenizerModule *)0x0) {
      iVar1 = sqlite3_stricmp(zName,pFVar3->zName);
      if (iVar1 == 0) {
        return pFVar3;
      }
      ppFVar2 = &pFVar3->pNext;
    }
    pFVar3 = (Fts5TokenizerModule *)0x0;
  }
  return pFVar3;
}

Assistant:

static Fts5TokenizerModule *fts5LocateTokenizer(
  Fts5Global *pGlobal, 
  const char *zName
){
  Fts5TokenizerModule *pMod = 0;

  if( zName==0 ){
    pMod = pGlobal->pDfltTok;
  }else{
    for(pMod=pGlobal->pTok; pMod; pMod=pMod->pNext){
      if( sqlite3_stricmp(zName, pMod->zName)==0 ) break;
    }
  }

  return pMod;
}